

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

int xmlStreamCompAddStep(xmlStreamCompPtr comp,xmlChar *name,xmlChar *ns,int nodeType,int flags)

{
  int iVar1;
  xmlStreamStepPtr pxVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = comp->maxStep;
  if (iVar1 <= comp->nbStep) {
    if (iVar1 < 1) {
      uVar4 = 4;
    }
    else {
      uVar4 = 0xffffffff;
      if ((iVar1 < 1000000000) &&
         (uVar3 = iVar1 + 1U >> 1, uVar4 = uVar3 + iVar1, (int)(1000000000 - uVar3) < iVar1)) {
        uVar4 = 1000000000;
      }
    }
    if ((int)uVar4 < 0) {
      return -1;
    }
    pxVar2 = (xmlStreamStepPtr)(*xmlRealloc)(comp->steps,(ulong)uVar4 << 5);
    if (pxVar2 == (xmlStreamStepPtr)0x0) {
      return -1;
    }
    comp->steps = pxVar2;
    comp->maxStep = uVar4;
  }
  pxVar2 = comp->steps;
  iVar1 = comp->nbStep;
  comp->nbStep = iVar1 + 1;
  pxVar2[iVar1].flags = flags;
  pxVar2[iVar1].name = name;
  pxVar2[iVar1].ns = ns;
  pxVar2[iVar1].nodeType = nodeType;
  return iVar1;
}

Assistant:

static int
xmlStreamCompAddStep(xmlStreamCompPtr comp, const xmlChar *name,
                     const xmlChar *ns, int nodeType, int flags) {
    xmlStreamStepPtr cur;

    if (comp->nbStep >= comp->maxStep) {
        xmlStreamStepPtr tmp;
        int newSize;

        newSize = xmlGrowCapacity(comp->maxStep, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamComp: growCapacity failed\n");
	    return(-1);
        }
	cur = xmlRealloc(comp->steps, newSize * sizeof(tmp[0]));
	if (cur == NULL) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamComp: malloc failed\n");
	    return(-1);
	}
	comp->steps = cur;
        comp->maxStep = newSize;
    }
    cur = &comp->steps[comp->nbStep++];
    cur->flags = flags;
    cur->name = name;
    cur->ns = ns;
    cur->nodeType = nodeType;
    return(comp->nbStep - 1);
}